

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_relation.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::UpdateRelation::Bind
          (BoundStatement *__return_storage_ptr__,UpdateRelation *this,Binder *binder)

{
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> _Var1
  ;
  pointer puVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  undefined8 uVar4;
  _Head_base<0UL,_duckdb::UpdateSetInfo_*,_false> __ptr_00;
  BaseTableRef *this_00;
  pointer pBVar5;
  _Head_base<0UL,_duckdb::UpdateSetInfo_*,_false> this_01;
  pointer pPVar6;
  pointer pUVar7;
  pointer *__ptr;
  pointer __p;
  pointer this_02;
  bool bVar8;
  templated_unique_single_t basetable;
  UpdateStatement stmt;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_140;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> local_138;
  Binder *local_130;
  undefined1 local_128 [160];
  _Head_base<0UL,_duckdb::UpdateSetInfo_*,_false> local_88;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
  local_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_130 = binder;
  this_00 = (BaseTableRef *)operator_new(0xd0);
  BaseTableRef::BaseTableRef(this_00);
  local_138._M_head_impl = this_00;
  pBVar5 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_138);
  ::std::__cxx11::string::_M_assign((string *)&pBVar5->catalog_name);
  pBVar5 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_138);
  ::std::__cxx11::string::_M_assign((string *)&pBVar5->schema_name);
  pBVar5 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_138);
  ::std::__cxx11::string::_M_assign((string *)&pBVar5->table_name);
  UpdateStatement::UpdateStatement((UpdateStatement *)local_128);
  this_01._M_head_impl = (UpdateSetInfo *)operator_new(0x38);
  UpdateSetInfo::UpdateSetInfo(this_01._M_head_impl);
  __ptr_00._M_head_impl = local_88._M_head_impl;
  local_140._M_head_impl = (ParsedExpression *)0x0;
  bVar8 = (_Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>)local_88._M_head_impl !=
          (_Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>)0x0;
  local_88._M_head_impl = this_01._M_head_impl;
  if (bVar8) {
    ::std::default_delete<duckdb::UpdateSetInfo>::operator()
              ((default_delete<duckdb::UpdateSetInfo> *)&local_88,__ptr_00._M_head_impl);
  }
  if ((UpdateSetInfo *)local_140._M_head_impl != (UpdateSetInfo *)0x0) {
    ::std::default_delete<duckdb::UpdateSetInfo>::operator()
              ((default_delete<duckdb::UpdateSetInfo> *)&local_140,
               (UpdateSetInfo *)local_140._M_head_impl);
  }
  if ((this->condition).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
      (ParsedExpression *)0x0) {
    local_140._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->condition);
    (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_140,pPVar6);
  }
  pUVar7 = unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
           operator->((unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>
                       *)&local_88);
  _Var3._M_head_impl = local_140._M_head_impl;
  local_140._M_head_impl = (ParsedExpression *)0x0;
  _Var1.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (pUVar7->condition).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>;
  (pUVar7->condition).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> =
       (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)_Var3._M_head_impl;
  if (_Var1.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                          _M_head_impl + 8))();
  }
  if (local_140._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_140._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  uVar4 = local_128._120_8_;
  local_128._120_8_ = local_138._M_head_impl;
  local_138._M_head_impl = (BaseTableRef *)0x0;
  if ((TableRef *)uVar4 != (TableRef *)0x0) {
    (**(code **)(*(long *)uVar4 + 8))();
  }
  pUVar7 = unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
           operator->((unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>
                       *)&local_88);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pUVar7->columns,
              &(this->update_columns).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  this_02 = (this->expressions).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->expressions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_02 != puVar2) {
    do {
      pUVar7 = unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
               operator->((unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>
                           *)&local_88);
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_02);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_140,pPVar6);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pUVar7->expressions,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_140);
      if (local_140._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_140._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      this_02 = this_02 + 1;
    } while (this_02 != puVar2);
  }
  Binder::Bind(__return_storage_ptr__,local_130,(SQLStatement *)local_128);
  local_128._0_8_ = &PTR__UpdateStatement_0247e7a8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
  ::~vector(&local_80);
  if ((tuple<duckdb::UpdateSetInfo_*,_std::default_delete<duckdb::UpdateSetInfo>_>)
      local_88._M_head_impl != (_Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>)0x0) {
    ::std::default_delete<duckdb::UpdateSetInfo>::operator()
              ((default_delete<duckdb::UpdateSetInfo> *)&local_88,local_88._M_head_impl);
  }
  local_88._M_head_impl = (UpdateSetInfo *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)(local_128 + 0x88));
  if ((__uniq_ptr_data<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true,_true>)
      local_128._128_8_ != (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)0x0) {
    (**(code **)(*(long *)local_128._128_8_ + 8))();
  }
  local_128._128_8_ =
       (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)0x0;
  if ((_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
      local_128._120_8_ != (TableRef *)0x0) {
    (**(code **)(*(long *)local_128._120_8_ + 8))();
  }
  local_128._120_8_ = (_Head_base<0UL,_duckdb::TableRef_*,_false>)0x0;
  SQLStatement::~SQLStatement((SQLStatement *)local_128);
  if (local_138._M_head_impl != (BaseTableRef *)0x0) {
    (*((local_138._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement UpdateRelation::Bind(Binder &binder) {
	auto basetable = make_uniq<BaseTableRef>();
	basetable->catalog_name = catalog_name;
	basetable->schema_name = schema_name;
	basetable->table_name = table_name;

	UpdateStatement stmt;
	stmt.set_info = make_uniq<UpdateSetInfo>();

	stmt.set_info->condition = condition ? condition->Copy() : nullptr;
	stmt.table = std::move(basetable);
	stmt.set_info->columns = update_columns;
	for (auto &expr : expressions) {
		stmt.set_info->expressions.push_back(expr->Copy());
	}
	return binder.Bind(stmt.Cast<SQLStatement>());
}